

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PcaModel.hpp
# Opt level: O0

void __thiscall eos::morphablemodel::PcaModel::PcaModel(PcaModel *this,PcaModel *param_1)

{
  PcaModel *param_1_local;
  PcaModel *this_local;
  
  Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::Matrix(&this->mean,&param_1->mean);
  Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::Matrix
            (&this->orthonormal_pca_basis,&param_1->orthonormal_pca_basis);
  Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::Matrix
            (&this->rescaled_pca_basis,&param_1->rescaled_pca_basis);
  Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::Matrix(&this->eigenvalues,&param_1->eigenvalues);
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
            (&this->triangle_list,&param_1->triangle_list);
  return;
}

Assistant:

PcaModel() = default;